

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O3

void lose_weapon_skill(int n)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  if (0 < n) {
    uVar5 = n + 1;
    iVar3 = u.weapon_slots;
    do {
      if (iVar3 == 0) {
        lVar4 = (long)u.skills_advanced;
        if (lVar4 != 0) {
          u.skills_advanced = u.skills_advanced + -1;
          cVar1 = u.skill_record[lVar4 + -1];
          uVar6 = (ulong)cVar1;
          cVar2 = u.weapon_skills[uVar6].skill;
          if (cVar2 < '\x02') {
            panic("lose_weapon_skill (%d)",uVar6 & 0xffffffff);
          }
          cVar2 = cVar2 + -1;
          u.weapon_skills[uVar6].skill = cVar2;
          iVar3 = (int)cVar2;
          if (cVar1 != '&' && '\x1d' < cVar1) {
            iVar3 = (int)(char)(iVar3 + ((iVar3 + 1U & 0xffff) >> 0xf) + 1 >> 1);
          }
          goto LAB_00286629;
        }
        iVar3 = 0;
      }
      else {
LAB_00286629:
        iVar3 = iVar3 + -1;
        u.weapon_slots = iVar3;
      }
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  return;
}

Assistant:

void lose_weapon_skill(int n)
{
    int skill;

    while (--n >= 0) {
	/* deduct first from unused slots, then from last placed slot, if any */
	if (u.weapon_slots) {
	    u.weapon_slots--;
	} else if (u.skills_advanced) {
	    skill = u.skill_record[--u.skills_advanced];
	    if (P_SKILL(skill) <= P_UNSKILLED)
		panic("lose_weapon_skill (%d)", skill);
	    P_SKILL(skill)--;	/* drop skill one level */
	    /* Lost skill might have taken more than one slot; refund rest. */
	    u.weapon_slots = slots_required(skill) - 1;
	    /* It might now be possible to advance some other pending
	       skill by using the refunded slots, but giving a message
	       to that effect would seem pretty confusing.... */
	}
    }
}